

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall Potassco::AspifTextInput::matchTerm(AspifTextInput *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  BufferedStream *pBVar4;
  BufferedStream *in_RDI;
  char c;
  bool in_stack_0000004f;
  char *in_stack_00000050;
  AspifTextInput *in_stack_00000058;
  char in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined7 in_stack_fffffffffffffff0;
  
  pBVar4 = ProgramReader::stream((ProgramReader *)in_RDI);
  bVar1 = BufferedStream::peek(pBVar4);
  iVar3 = islower((uint)bVar1);
  if ((iVar3 == 0) && (bVar1 != 0x5f)) {
    if (bVar1 == 0x22) {
      matchStr((AspifTextInput *)CONCAT17(0x22,in_stack_fffffffffffffff0));
    }
    else {
      ProgramReader::require
                ((ProgramReader *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                 (bool)in_stack_ffffffffffffffdf,(char *)0x10f40a);
    }
  }
  else {
    do {
      ProgramReader::stream((ProgramReader *)in_RDI);
      BufferedStream::get(in_RDI);
      push((AspifTextInput *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdf);
      pBVar4 = ProgramReader::stream((ProgramReader *)in_RDI);
      bVar1 = BufferedStream::peek(pBVar4);
      iVar3 = isalnum((uint)bVar1);
      in_stack_ffffffffffffffe7 = iVar3 != 0 || bVar1 == 0x5f;
    } while ((bool)in_stack_ffffffffffffffe7);
    skipws((AspifTextInput *)0x10f35e);
    bVar2 = match(in_stack_00000058,in_stack_00000050,in_stack_0000004f);
    if (bVar2) {
      push((AspifTextInput *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdf);
      while( true ) {
        matchAtomArg((AspifTextInput *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0)
                    );
        bVar2 = match(in_stack_00000058,in_stack_00000050,in_stack_0000004f);
        if (!bVar2) break;
        push((AspifTextInput *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdf);
      }
      match(in_stack_00000058,in_stack_00000050,in_stack_0000004f);
      push((AspifTextInput *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdf);
    }
  }
  skipws((AspifTextInput *)0x10f416);
  return;
}

Assistant:

void AspifTextInput::matchTerm() {
	char c = stream()->peek();
	if (std::islower(static_cast<unsigned char>(c)) != 0 || c == '_') {
		do { push(stream()->get()); } while (std::isalnum(static_cast<unsigned char>(c = stream()->peek())) != 0 || c == '_');
		skipws();
		if (match("(", false)) {
			push('(');
			for (;;) {
				matchAtomArg();
				if (!match(",", false)) break;
				push(',');
			}
			match(")");
			push(')');
		}
	}
	else if (c == '"') { matchStr(); }
	else { require(false, "<term> expected"); }
	skipws();
}